

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void rollback_with_num_keeping_headers(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  char *pcVar3;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  sb_decision_t sb_decision;
  fdb_kvs_info kvs_info;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  char bodybuf [1024];
  char keybuf [256];
  int r;
  int n;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffff7c8;
  FILE *pFVar4;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  size_t in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  fdb_kvs_handle *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  fdb_kvs_handle *in_stack_fffffffffffff808;
  fdb_seqnum_t in_stack_fffffffffffff8f0;
  fdb_kvs_handle **in_stack_fffffffffffff8f8;
  fdb_kvs_info *in_stack_fffffffffffff930;
  fdb_kvs_handle *in_stack_fffffffffffff938;
  fdb_config *in_stack_fffffffffffff9e8;
  char *in_stack_fffffffffffff9f0;
  fdb_file_handle **in_stack_fffffffffffff9f8;
  ulong local_5d8;
  long local_5a0;
  char local_568 [1024];
  char local_168 [268];
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_5c = system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             (fdb_kvs_handle **)in_stack_fffffffffffff7c8,(fdb_kvs_config *)0x10c273);
  for (local_54 = 0; (int)local_54 < 10; local_54 = local_54 + 1) {
    sprintf(local_168,"%dkey",(ulong)local_54);
    fillstr(local_568,'b',0x200);
    strlen(local_168);
    strlen(local_568);
    fVar1 = fdb_set_kv(in_stack_fffffffffffff808,
                       (void *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                       (size_t)in_stack_fffffffffffff7f8,
                       (void *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                       in_stack_fffffffffffff7e8);
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3d3);
      rollback_with_num_keeping_headers::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3d3,"void rollback_with_num_keeping_headers()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7c8,'\0');
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3d5);
      rollback_with_num_keeping_headers::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3d5,"void rollback_with_num_keeping_headers()");
    }
  }
  local_54 = 0;
  do {
    sprintf(local_168,"0key");
    fillstr(local_568,'c',0x80);
    strlen(local_168);
    strlen(local_568);
    fVar1 = fdb_set_kv(in_stack_fffffffffffff808,
                       (void *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                       (size_t)in_stack_fffffffffffff7f8,
                       (void *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                       in_stack_fffffffffffff7e8);
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3df);
      rollback_with_num_keeping_headers::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3df,"void rollback_with_num_keeping_headers()");
    }
    local_54 = local_54 + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffff808,
                              (fdb_file_info *)
                              CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3e2);
      rollback_with_num_keeping_headers::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3e2,"void rollback_with_num_keeping_headers()");
    }
  } while (local_5d8 < 0x1000000);
  local_58 = local_54;
  sVar2 = sb_check_block_reusing(in_stack_fffffffffffff7f8);
  if (sVar2 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,1000);
    rollback_with_num_keeping_headers::__test_pass = 0;
    if (sVar2 != SBD_RECLAIM) {
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,1000,"void rollback_with_num_keeping_headers()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7c8,'\0');
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x3ec);
    rollback_with_num_keeping_headers::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x3ec,"void rollback_with_num_keeping_headers()");
  }
  for (local_54 = 0; (int)local_54 < local_58; local_54 = local_54 + 1) {
    sprintf(local_168,"%dkey",(ulong)local_54);
    fillstr(local_568,'d',0x200);
    strlen(local_168);
    strlen(local_568);
    fVar1 = fdb_set_kv(in_stack_fffffffffffff808,
                       (void *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                       (size_t)in_stack_fffffffffffff7f8,
                       (void *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                       in_stack_fffffffffffff7e8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar4 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3f4);
      rollback_with_num_keeping_headers::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3f4,"void rollback_with_num_keeping_headers()");
    }
  }
  fVar1 = fdb_rollback(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar4 = _stderr;
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x3f9);
    rollback_with_num_keeping_headers::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x3f9,"void rollback_with_num_keeping_headers()");
  }
  fVar1 = fdb_get_kvs_info(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar4 = _stderr;
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x3fd);
    rollback_with_num_keeping_headers::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x3fd,"void rollback_with_num_keeping_headers()");
  }
  if (local_5a0 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x3fe);
    rollback_with_num_keeping_headers::__test_pass = 0;
    if (local_5a0 != 10) {
      __assert_fail("kvs_info.doc_count == 10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3fe,"void rollback_with_num_keeping_headers()");
    }
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffff7c8);
  pFVar4 = _stderr;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffff7c8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      if (rollback_with_num_keeping_headers::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","rollback with num keeping headers");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","rollback with num keeping headers");
      }
      return;
    }
    pFVar4 = _stderr;
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x404);
    rollback_with_num_keeping_headers::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x404,"void rollback_with_num_keeping_headers()");
  }
  pcVar3 = fdb_error_msg(fVar1);
  fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x402);
  rollback_with_num_keeping_headers::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x402,"void rollback_with_num_keeping_headers()");
}

Assistant:

void rollback_with_num_keeping_headers() {
    TEST_INIT();
    memleak_start();

    int i, n, r;
    char keybuf[256];
    char bodybuf[1024];
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_info kvs_info;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 1;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create 10 headers
    for (i = 0; i < 10; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    n = i;

    // expect block reclaim
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // reclaim old header via 11th commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // load unique keys to reuse old blocks
    for (i = 0; i < n; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }

    // do rollback to 10th headers
    status = fdb_rollback(&db, 10);
    TEST_STATUS(status);

    // expect only 10 docs
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_STATUS(status);
    TEST_CHK(kvs_info.doc_count == 10);

    // cleanup
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback with num keeping headers");
}